

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O0

CURLcode cr_mime_read(Curl_easy *data,Curl_creader *reader,char *buf,size_t blen,size_t *pnread,
                     _Bool *peos)

{
  void *pvVar1;
  _Bool _Var2;
  ssize_t sVar3;
  ssize_t n_1;
  size_t *psStack_170;
  CURLcode result_1;
  ssize_t n;
  size_t *psStack_160;
  CURLcode result;
  curl_off_t remain;
  char tmp [256];
  size_t *local_50;
  size_t nread;
  cr_mime_ctx *ctx;
  _Bool *peos_local;
  size_t *pnread_local;
  size_t blen_local;
  char *buf_local;
  Curl_creader *reader_local;
  Curl_easy *data_local;
  
  pvVar1 = reader->ctx;
  if ((*(byte *)((long)pvVar1 + 0x80) >> 1 & 1) == 0) {
    if ((*(byte *)((long)pvVar1 + 0x80) & 1) == 0) {
      pnread_local = (size_t *)blen;
      if (-1 < *(long *)((long)pvVar1 + 0x28)) {
        psStack_160 = (size_t *)(*(long *)((long)pvVar1 + 0x28) - *(long *)((long)pvVar1 + 0x30));
        if ((long)psStack_160 < 1) {
          pnread_local = (size_t *)0x0;
        }
        else if ((long)psStack_160 < (long)blen) {
          pnread_local = psStack_160;
        }
      }
      _Var2 = Curl_bufq_is_empty((bufq *)((long)pvVar1 + 0x40));
      if (_Var2) {
        if (pnread_local < (size_t *)0x5) {
          if ((((data != (Curl_easy *)0x0) &&
               ((*(ulong *)&(data->set).field_0x89c >> 0x1e & 1) != 0)) &&
              (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level))
              )) && (0 < Curl_trc_feat_read.log_level)) {
            Curl_trc_read(data,"cr_mime_read(len=%zu), small read, using tmp",pnread_local);
          }
          local_50 = (size_t *)
                     Curl_mime_read((char *)&remain,1,0x100,*(void **)((long)pvVar1 + 0x20));
          if (local_50 < (size_t *)0x101) {
            n_1._4_4_ = CURLE_OK;
            sVar3 = Curl_bufq_write((bufq *)((long)pvVar1 + 0x40),(uchar *)&remain,(size_t)local_50,
                                    (CURLcode *)((long)&n_1 + 4));
            if (sVar3 < 0) {
              *(byte *)((long)pvVar1 + 0x80) = *(byte *)((long)pvVar1 + 0x80) & 0xfd | 2;
              *(CURLcode *)((long)pvVar1 + 0x38) = n_1._4_4_;
              return n_1._4_4_;
            }
            local_50 = (size_t *)
                       Curl_bufq_read((bufq *)((long)pvVar1 + 0x40),(uchar *)buf,
                                      (size_t)pnread_local,(CURLcode *)((long)&n_1 + 4));
            if ((long)local_50 < 0) {
              *(byte *)((long)pvVar1 + 0x80) = *(byte *)((long)pvVar1 + 0x80) & 0xfd | 2;
              *(CURLcode *)((long)pvVar1 + 0x38) = n_1._4_4_;
              return n_1._4_4_;
            }
          }
        }
        else {
          local_50 = (size_t *)
                     Curl_mime_read(buf,1,(size_t)pnread_local,*(void **)((long)pvVar1 + 0x20));
        }
      }
      else {
        n._4_4_ = CURLE_OK;
        psStack_170 = (size_t *)
                      Curl_bufq_read((bufq *)((long)pvVar1 + 0x40),(uchar *)buf,(size_t)pnread_local
                                     ,(CURLcode *)((long)&n + 4));
        local_50 = psStack_170;
        if ((long)psStack_170 < 0) {
          *(byte *)((long)pvVar1 + 0x80) = *(byte *)((long)pvVar1 + 0x80) & 0xfd | 2;
          *(CURLcode *)((long)pvVar1 + 0x38) = n._4_4_;
          return n._4_4_;
        }
      }
      if (((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x89c >> 0x1e & 1) != 0)) &&
         ((((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)) &&
          (0 < Curl_trc_feat_read.log_level)))) {
        Curl_trc_read(data,"cr_mime_read(len=%zu), mime_read() -> %zd",pnread_local,local_50);
      }
      if ((long)local_50 + 2U < 2) {
        Curl_failf(data,"read error getting mime data");
        *pnread = 0;
        *peos = false;
        *(byte *)((long)pvVar1 + 0x80) = *(byte *)((long)pvVar1 + 0x80) & 0xfd | 2;
        *(undefined4 *)((long)pvVar1 + 0x38) = 0x1a;
        data_local._4_4_ = CURLE_READ_ERROR;
      }
      else {
        if (local_50 == (size_t *)0x0) {
          if ((-1 < *(long *)((long)pvVar1 + 0x28)) &&
             (*(long *)((long)pvVar1 + 0x30) < *(long *)((long)pvVar1 + 0x28))) {
            Curl_failf(data,"client mime read EOF fail, only %ld/%ld of needed bytes read",
                       *(undefined8 *)((long)pvVar1 + 0x30),*(undefined8 *)((long)pvVar1 + 0x28));
            return CURLE_READ_ERROR;
          }
          *pnread = 0;
          *peos = true;
          *(byte *)((long)pvVar1 + 0x80) = *(byte *)((long)pvVar1 + 0x80) & 0xfe | 1;
        }
        else {
          if (local_50 == (size_t *)0x10000000) {
            Curl_failf(data,"operation aborted by callback");
            *pnread = 0;
            *peos = false;
            *(byte *)((long)pvVar1 + 0x80) = *(byte *)((long)pvVar1 + 0x80) & 0xfd | 2;
            *(undefined4 *)((long)pvVar1 + 0x38) = 0x2a;
            return CURLE_ABORTED_BY_CALLBACK;
          }
          if (local_50 == (size_t *)0x10000001) {
            if ((((data != (Curl_easy *)0x0) &&
                 ((*(ulong *)&(data->set).field_0x89c >> 0x1e & 1) != 0)) &&
                (((data->state).feat == (curl_trc_feat *)0x0 ||
                 (0 < ((data->state).feat)->log_level)))) && (0 < Curl_trc_feat_read.log_level)) {
              Curl_trc_read(data,"cr_mime_read(len=%zu), paused by callback",pnread_local);
            }
            (data->req).keepon = (data->req).keepon | 0x20;
            *pnread = 0;
            *peos = false;
          }
          else {
            if (pnread_local < local_50) {
              Curl_failf(data,"read function returned funny value");
              *pnread = 0;
              *peos = false;
              *(byte *)((long)pvVar1 + 0x80) = *(byte *)((long)pvVar1 + 0x80) & 0xfd | 2;
              *(undefined4 *)((long)pvVar1 + 0x38) = 0x1a;
              return CURLE_READ_ERROR;
            }
            *(long *)((long)pvVar1 + 0x30) = (long)local_50 + *(long *)((long)pvVar1 + 0x30);
            if (-1 < *(long *)((long)pvVar1 + 0x28)) {
              *(byte *)((long)pvVar1 + 0x80) =
                   *(byte *)((long)pvVar1 + 0x80) & 0xfe |
                   *(long *)((long)pvVar1 + 0x28) <= *(long *)((long)pvVar1 + 0x30);
            }
            *pnread = (size_t)local_50;
            *peos = (*(byte *)((long)pvVar1 + 0x80) & 1) != 0;
          }
        }
        if ((((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x89c >> 0x1e & 1) != 0))
            && (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)
                ))) && (0 < Curl_trc_feat_read.log_level)) {
          Curl_trc_read(data,"cr_mime_read(len=%zu, total=%ld, read=%ld) -> %d, %zu, %d",
                        pnread_local,*(undefined8 *)((long)pvVar1 + 0x28),
                        *(undefined8 *)((long)pvVar1 + 0x30),0,*pnread,(uint)(*peos & 1));
        }
        data_local._4_4_ = CURLE_OK;
      }
    }
    else {
      if ((((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x89c >> 0x1e & 1) != 0))
          && (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)))
          ) && (0 < Curl_trc_feat_read.log_level)) {
        Curl_trc_read(data,"cr_mime_read(len=%zu) seen eos -> 0, eos=1",blen);
      }
      *pnread = 0;
      *peos = true;
      data_local._4_4_ = CURLE_OK;
    }
  }
  else {
    if (((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x89c >> 0x1e & 1) != 0)) &&
       ((((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)) &&
        (0 < Curl_trc_feat_read.log_level)))) {
      Curl_trc_read(data,"cr_mime_read(len=%zu) is errored -> %d, eos=0",blen,
                    (ulong)*(uint *)((long)pvVar1 + 0x38));
    }
    *pnread = 0;
    *peos = false;
    data_local._4_4_ = *(CURLcode *)((long)pvVar1 + 0x38);
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode cr_mime_read(struct Curl_easy *data,
                             struct Curl_creader *reader,
                             char *buf, size_t blen,
                             size_t *pnread, bool *peos)
{
  struct cr_mime_ctx *ctx = reader->ctx;
  size_t nread;
  char tmp[256];


  /* Once we have errored, we will return the same error forever */
  if(ctx->errored) {
    CURL_TRC_READ(data, "cr_mime_read(len=%zu) is errored -> %d, eos=0",
                  blen, ctx->error_result);
    *pnread = 0;
    *peos = FALSE;
    return ctx->error_result;
  }
  if(ctx->seen_eos) {
    CURL_TRC_READ(data, "cr_mime_read(len=%zu) seen eos -> 0, eos=1", blen);
    *pnread = 0;
    *peos = TRUE;
    return CURLE_OK;
  }
  /* respect length limitations */
  if(ctx->total_len >= 0) {
    curl_off_t remain = ctx->total_len - ctx->read_len;
    if(remain <= 0)
      blen = 0;
    else if(remain < (curl_off_t)blen)
      blen = (size_t)remain;
  }

  if(!Curl_bufq_is_empty(&ctx->tmpbuf)) {
    CURLcode result = CURLE_OK;
    ssize_t n = Curl_bufq_read(&ctx->tmpbuf, (unsigned char *)buf, blen,
                               &result);
    if(n < 0) {
      ctx->errored = TRUE;
      ctx->error_result = result;
      return result;
    }
    nread = (size_t)n;
  }
  else if(blen <= 4) {
    /* Curl_mime_read() may go into an infinite loop when reading
     * via a base64 encoder, as it stalls when the read buffer is too small
     * to contain a complete 3 byte encoding. Read into a larger buffer
     * and use that until empty. */
    CURL_TRC_READ(data, "cr_mime_read(len=%zu), small read, using tmp", blen);
    nread = Curl_mime_read(tmp, 1, sizeof(tmp), ctx->part);
    if(nread <= sizeof(tmp)) {
      CURLcode result = CURLE_OK;
      ssize_t n = Curl_bufq_write(&ctx->tmpbuf, (unsigned char *)tmp, nread,
                                  &result);
      if(n < 0) {
        ctx->errored = TRUE;
        ctx->error_result = result;
        return result;
      }
      /* stored it, read again */
      n = Curl_bufq_read(&ctx->tmpbuf, (unsigned char *)buf, blen, &result);
      if(n < 0) {
        ctx->errored = TRUE;
        ctx->error_result = result;
        return result;
      }
      nread = (size_t)n;
    }
  }
  else
    nread = Curl_mime_read(buf, 1, blen, ctx->part);

  CURL_TRC_READ(data, "cr_mime_read(len=%zu), mime_read() -> %zd",
                blen, nread);

  switch(nread) {
  case 0:
    if((ctx->total_len >= 0) && (ctx->read_len < ctx->total_len)) {
      failf(data, "client mime read EOF fail, "
            "only %"FMT_OFF_T"/%"FMT_OFF_T
            " of needed bytes read", ctx->read_len, ctx->total_len);
      return CURLE_READ_ERROR;
    }
    *pnread = 0;
    *peos = TRUE;
    ctx->seen_eos = TRUE;
    break;

  case CURL_READFUNC_ABORT:
    failf(data, "operation aborted by callback");
    *pnread = 0;
    *peos = FALSE;
    ctx->errored = TRUE;
    ctx->error_result = CURLE_ABORTED_BY_CALLBACK;
    return CURLE_ABORTED_BY_CALLBACK;

  case CURL_READFUNC_PAUSE:
    /* CURL_READFUNC_PAUSE pauses read callbacks that feed socket writes */
    CURL_TRC_READ(data, "cr_mime_read(len=%zu), paused by callback", blen);
    data->req.keepon |= KEEP_SEND_PAUSE; /* mark socket send as paused */
    *pnread = 0;
    *peos = FALSE;
    break; /* nothing was read */

  case STOP_FILLING:
  case READ_ERROR:
    failf(data, "read error getting mime data");
    *pnread = 0;
    *peos = FALSE;
    ctx->errored = TRUE;
    ctx->error_result = CURLE_READ_ERROR;
    return CURLE_READ_ERROR;

  default:
    if(nread > blen) {
      /* the read function returned a too large value */
      failf(data, "read function returned funny value");
      *pnread = 0;
      *peos = FALSE;
      ctx->errored = TRUE;
      ctx->error_result = CURLE_READ_ERROR;
      return CURLE_READ_ERROR;
    }
    ctx->read_len += nread;
    if(ctx->total_len >= 0)
      ctx->seen_eos = (ctx->read_len >= ctx->total_len);
    *pnread = nread;
    *peos = ctx->seen_eos;
    break;
  }

  CURL_TRC_READ(data, "cr_mime_read(len=%zu, total=%" FMT_OFF_T
                ", read=%"FMT_OFF_T") -> %d, %zu, %d",
                blen, ctx->total_len, ctx->read_len, CURLE_OK, *pnread, *peos);
  return CURLE_OK;
}